

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bio.c
# Opt level: O0

int16 * bio_read_wavfile(char *directory,char *filename,char *extension,int32 header,int32 endian,
                        size_t *nsamps)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  char *__s;
  FILE *__stream;
  ulong n_elem;
  int16 *data;
  size_t l;
  size_t n;
  char *inputfile;
  FILE *uttfp;
  size_t *nsamps_local;
  int32 endian_local;
  int32 header_local;
  char *extension_local;
  char *filename_local;
  char *directory_local;
  
  sVar2 = strlen(extension);
  sVar3 = strlen(filename);
  _endian_local = extension;
  if ((sVar2 <= sVar3) && (iVar1 = strcmp(filename + (sVar3 - sVar2),extension), iVar1 == 0)) {
    _endian_local = "";
  }
  sVar4 = strlen(directory);
  __s = (char *)__ckd_calloc__(sVar4 + sVar3 + sVar2 + 2,1,
                               "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/bio.c"
                               ,0x262);
  if (directory == (char *)0x0) {
    sprintf(__s,"%s%s",filename,_endian_local);
  }
  else {
    sprintf(__s,"%s/%s%s",directory,filename,_endian_local);
  }
  __stream = fopen(__s,"rb");
  if (__stream != (FILE *)0x0) {
    fseek(__stream,0,2);
    l = ftell(__stream);
    fseek(__stream,0,0);
    if (0 < header) {
      iVar1 = fseek(__stream,(long)header,0);
      if (iVar1 < 0) {
        err_msg_system(ERR_ERROR,
                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/bio.c"
                       ,0x271,"Failed to move to an offset %d in a file \'%s\'",(ulong)(uint)header,
                       __s);
        fclose(__stream);
        ckd_free(__s);
        return (int16 *)0x0;
      }
      l = l - (long)header;
    }
    n_elem = l >> 1;
    directory_local =
         (char *)__ckd_calloc__(n_elem,2,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/bio.c"
                                ,0x279);
    sVar2 = fread(directory_local,2,n_elem,__stream);
    if (sVar2 < n_elem) {
      err_msg_system(ERR_ERROR,
                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/bio.c"
                     ,0x27b,"Failed to read %d samples from %s: %d",n_elem,__s,sVar2);
      ckd_free(directory_local);
      ckd_free(__s);
      fclose(__stream);
      directory_local = (char *)0x0;
    }
    else {
      ckd_free(__s);
      fclose(__stream);
      if (nsamps != (size_t *)0x0) {
        *nsamps = n_elem;
      }
    }
    return (int16 *)directory_local;
  }
  err_msg_system(ERR_FATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/bio.c"
                 ,0x26a,"Failed to open file \'%s\' for reading",__s);
  exit(1);
}

Assistant:

int16*
bio_read_wavfile(char const *directory,
		 char const *filename,
		 char const *extension,
		 int32 header,
		 int32 endian,
		 size_t *nsamps)
{
    FILE *uttfp;
    char *inputfile;
    size_t n, l;
    int16 *data;

    (void)endian;
    n = strlen(extension);
    l = strlen(filename);
    if ((n <= l) && (0 == strcmp(filename + l - n, extension)))
        extension = "";
    inputfile = ckd_calloc(strlen(directory) + l + n + 2, 1);
    if (directory) {
        sprintf(inputfile, "%s/%s%s", directory, filename, extension);
    } else {
        sprintf(inputfile, "%s%s", filename, extension);
    }

    if ((uttfp = fopen(inputfile, "rb")) == NULL) {
        E_FATAL_SYSTEM("Failed to open file '%s' for reading", inputfile);
    }
    fseek(uttfp, 0, SEEK_END);
    n = ftell(uttfp);
    fseek(uttfp, 0, SEEK_SET);
    if (header > 0) {
        if (fseek(uttfp, header, SEEK_SET) < 0) {
            E_ERROR_SYSTEM("Failed to move to an offset %d in a file '%s'", header, inputfile);
            fclose(uttfp);
            ckd_free(inputfile);
            return NULL;
        }
        n -= header;
    }
    n /= sizeof(int16);
    data = ckd_calloc(n, sizeof(*data));
    if ((l = fread(data, sizeof(int16), n, uttfp)) < n) {
        E_ERROR_SYSTEM("Failed to read %d samples from %s: %d", n, inputfile, l);
        ckd_free(data);
        ckd_free(inputfile);
        fclose(uttfp);
        return NULL;
    }
    ckd_free(inputfile);
    fclose(uttfp);
    if (nsamps) *nsamps = n;

    return data;
}